

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O2

fruit * loadfruitchn(memfile *mf)

{
  fruit *pfVar1;
  int32_t iVar2;
  int32_t iVar3;
  fruit *pfVar4;
  fruit *pfVar5;
  bool bVar6;
  
  mfmagic_check(mf,0x48435246);
  iVar2 = mread32(mf);
  pfVar5 = (fruit *)0x0;
  while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
    pfVar4 = (fruit *)malloc(0x30);
    mread(mf,pfVar4,0x20);
    iVar3 = mread32(mf);
    pfVar4->fid = iVar3;
    pfVar4->nextf = pfVar5;
    pfVar5 = pfVar4;
  }
  pfVar4 = (fruit *)0x0;
  while (pfVar5 != (fruit *)0x0) {
    pfVar1 = pfVar5->nextf;
    pfVar5->nextf = pfVar4;
    pfVar4 = pfVar5;
    pfVar5 = pfVar1;
  }
  return pfVar4;
}

Assistant:

static struct fruit *loadfruitchn(struct memfile *mf)
{
	struct fruit *flist = NULL, *fnext, *fcurr, *fprev;
	unsigned int count;

	mfmagic_check(mf, FRUITCHAIN_MAGIC);
	count = mread32(mf);
	while (count--) {
	    fnext = newfruit();
	    mread(mf, fnext->fname, sizeof(fnext->fname));
	    fnext->fid = mread32(mf);
	    fnext->nextf = flist;
	    flist = fnext;
	}

	/* fruit list loaded above is reversed, so put it back in the right order */
	fcurr = flist;
	fprev = NULL;
	while (fcurr) {
	    fnext = fcurr->nextf;
	    fcurr->nextf = fprev;
	    fprev = fcurr;
	    fcurr = fnext;
	}
	flist = fprev;

	return flist;
}